

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O1

Phdr ** endofsecdef(GlobalVars *gv,LinkedSection *ls)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  Phdr **__ptr;
  char *__s2;
  Phdr *pPVar8;
  char *pcVar9;
  MemoryDescr **ppMVar10;
  lword val;
  int local_54;
  uint16_t local_38 [4];
  
  __ptr = (Phdr **)alloc(0x200);
  endofblock('{','}');
  bVar3 = false;
  bVar2 = false;
  local_54 = 0;
  do {
    cVar4 = getchr();
    switch(cVar4) {
    case ':':
      __s2 = getarg('\x01');
      pcVar9 = scriptname;
      if (__s2 != (char *)0x0) {
        pPVar8 = find_phdr(gv,__s2,(MemoryDescr *)0x0,(MemoryDescr *)0x0);
        pcVar9 = scriptname;
        if (pPVar8 != (Phdr *)0x0) {
          iVar6 = local_54 + 1;
          __ptr[local_54] = pPVar8;
          bVar1 = 0x3e < local_54;
          local_54 = iVar6;
          if (bVar1) {
            ierror("%sphdrcnt overrun","endofsecdef(): ");
          }
          break;
        }
        uVar7 = getlineno();
        iVar6 = 0x6f;
        goto LAB_00113195;
      }
      uVar7 = getlineno();
      error(0x4e,pcVar9,(ulong)uVar7);
      break;
    case '=':
      iVar6 = parse_expr(-1,(lword *)local_38);
      pcVar9 = scriptname;
      if (iVar6 != 0) {
        gv->filldata = local_38[0];
        break;
      }
      uVar7 = getlineno();
      iVar6 = 0x43;
      goto LAB_0011316e;
    case '>':
    case '@':
      goto switchD_00112f6d_caseD_3e;
    case 'A':
      cVar5 = getchr();
      if (cVar5 != 'T') {
        back(2);
LAB_0011311f:
        bVar2 = true;
        break;
      }
      cVar5 = getchr();
      if (cVar5 != '>') {
        back(1);
        pcVar9 = scriptname;
        uVar7 = getlineno();
        error(0x42,pcVar9,(ulong)uVar7,0x3e);
      }
switchD_00112f6d_caseD_3e:
      __s2 = getarg('\x01');
      pcVar9 = scriptname;
      if (__s2 == (char *)0x0) {
        uVar7 = getlineno();
        iVar6 = 0x4e;
LAB_0011316e:
        error(iVar6,pcVar9,(ulong)uVar7);
LAB_0011319c:
        bVar3 = true;
      }
      else {
        ppMVar10 = &memory_blocks;
        do {
          ppMVar10 = &((MemoryDescr *)ppMVar10)->next->next;
          if ((MemoryDescr *)ppMVar10 == (MemoryDescr *)0x0) {
            ppMVar10 = (MemoryDescr **)0x0;
            break;
          }
          iVar6 = strcmp(((MemoryDescr *)ppMVar10)->name,__s2);
        } while (iVar6 != 0);
        pcVar9 = scriptname;
        if ((MemoryDescr *)ppMVar10 == (MemoryDescr *)0x0) {
          uVar7 = getlineno();
          iVar6 = 0x46;
LAB_00113195:
          error(iVar6,pcVar9,(ulong)uVar7,__s2);
          goto LAB_0011319c;
        }
        if (cVar4 == '>') {
          if ((ls != (LinkedSection *)0x0) &&
             (ls->relocmem = (MemoryDescr *)ppMVar10, vdefmem = (MemoryDescr *)ppMVar10,
             ls->destmem == (MemoryDescr *)0x0)) {
LAB_00113131:
            ls->destmem = (MemoryDescr *)ppMVar10;
            ldefmem = (MemoryDescr *)ppMVar10;
          }
        }
        else if (ls != (LinkedSection *)0x0) goto LAB_00113131;
      }
      break;
    default:
      if (cVar4 == '\0') goto LAB_0011311f;
    case ';':
    case '<':
    case '?':
      bVar2 = true;
      back(1);
    }
    if (bVar2) {
      if (bVar3) {
        free(__ptr);
        __ptr = (Phdr **)0x0;
      }
      else {
        __ptr[local_54] = (Phdr *)0x0;
      }
      return __ptr;
    }
  } while( true );
}

Assistant:

static struct Phdr **endofsecdef(struct GlobalVars *gv,
                                 struct LinkedSection *ls)
/* Parses syntax of everything which follows the '}' of a section
   definition. Memory-region pointers and fill-value will be initialized
   when the section-pointer 'ls' is given.
   On success the function returns a list of pointers to Phdr structures
   which were defined (terminated by a NULL pointer). This list must
   be deallocated by the caller!
   Syntax: } [>memregion] [AT>lma-region] [:phdr ...] [=fill] */
{
  const char *fn = "endofsecdef(): ";
  struct Phdr **pp = alloc(64 * sizeof(struct Phdr *));  /* it's ugly! */
  struct Phdr *phdr;
  struct MemoryDescr *md;
  int phdrcnt=0,done=0,err=0;
  char c,*buf;
  lword val;

  endofblock('{','}');

  while (!done) {
    switch (c = getchr()) {
      case '>':
      case '@':
      case 'A':
        if (c == 'A') {
          if (getchr() == 'T') {
            if (getchr() != '>') {
              back(1);
              error(66,scriptname,getlineno(),'>');  /* '>' expected */
            }
          }
          else {
            /* it's not AT, but maybe an ASSERT keyword, so get out */
            back(2);
            done = 1;
            break;
          }
        }
        if (buf = getword()) {
          if (md = find_memblock(buf)) {
            if (c == '>') {
              if (ls) {
                ls->relocmem = md;
                vdefmem = md;
                if (ls->destmem == NULL) {
                  ls->destmem = md;
                  ldefmem = md;
                }
              }
            }
            else if (ls) {
              ls->destmem = md;
              ldefmem = md;
            }
          }
          else {
            error(70,scriptname,getlineno(),buf);  /* Unknown memory region */
            err = 1;
          }
        }
        else {
          error(78,scriptname,getlineno());   /* missing argument */
          err = 1;
        }
        break;

      case ':':
        if (buf = getword()) {
          if (phdr = find_phdr(gv,buf,NULL,NULL)) {
            pp[phdrcnt++] = phdr;
            if (phdrcnt >= 64)
              ierror("%sphdrcnt overrun",fn);
          }
          else {
            error(111,scriptname,getlineno(),buf);  /* unknown PHDR */
            err = 1;
          }
        }
        else
          error(78,scriptname,getlineno());
        break;

      case '=':
        if (parse_expr(-1,&val)) {
          gv->filldata = (uint16_t)(val & 0xffff);
        }
        else {
          error(67,scriptname,getlineno());  /* Absolute number expected */
          err = 1;
        }
        break;

      case '\0':
        done = 1;
        break;

      default:
        done = 1;
        back(1);
        break;
    }
  }

  if (err) {
    free(pp);
    pp = NULL;
  }
  else
    pp[phdrcnt] = NULL;

  return pp;
}